

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimate.cc
# Opt level: O0

void anon_unknown.dwarf_1729::PrintUsage(ostream *stream)

{
  _Setw _Var1;
  ostream *poVar2;
  void *pvVar3;
  ostream *in_RDI;
  
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," decimate - data decimation");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  usage:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       decimate [ options ] [ infile ] > stdout");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  options:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -l l  : length of vector   (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,1);
  poVar2 = std::operator<<(poVar2,"][ 1 <= l <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -m m  : order of vector    (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = std::operator<<(poVar2,"l-1");
  poVar2 = std::operator<<(poVar2,"][ 0 <= m <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -s s  : start index        (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,0);
  poVar2 = std::operator<<(poVar2,"][ 0 <= s <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -p p  : decimation period  (   int)[");
  _Var1 = std::setw(5);
  poVar2 = std::operator<<(poVar2,_Var1);
  pvVar3 = (void *)std::ostream::operator<<(poVar2,std::right);
  poVar2 = (ostream *)std::ostream::operator<<(pvVar3,10);
  poVar2 = std::operator<<(poVar2,"][ 1 <= p <=   ]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       -h    : print this message");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  infile:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       data sequence              (double)[stdin]");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"  stdout:");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI,"       decimated data sequence    (double)");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(in_RDI," SPTK: version ");
  poVar2 = std::operator<<(poVar2,"4.3");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(in_RDI,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void PrintUsage(std::ostream* stream) {
  // clang-format off
  *stream << std::endl;
  *stream << " decimate - data decimation" << std::endl;
  *stream << std::endl;
  *stream << "  usage:" << std::endl;
  *stream << "       decimate [ options ] [ infile ] > stdout" << std::endl;
  *stream << "  options:" << std::endl;
  *stream << "       -l l  : length of vector   (   int)[" << std::setw(5) << std::right << kDefaultVectorLength     << "][ 1 <= l <=   ]" << std::endl;  // NOLINT
  *stream << "       -m m  : order of vector    (   int)[" << std::setw(5) << std::right << "l-1"                    << "][ 0 <= m <=   ]" << std::endl;  // NOLINT
  *stream << "       -s s  : start index        (   int)[" << std::setw(5) << std::right << kDefaultStartIndex       << "][ 0 <= s <=   ]" << std::endl;  // NOLINT
  *stream << "       -p p  : decimation period  (   int)[" << std::setw(5) << std::right << kDefaultDecimationPeriod << "][ 1 <= p <=   ]" << std::endl;  // NOLINT
  *stream << "       -h    : print this message" << std::endl;
  *stream << "  infile:" << std::endl;
  *stream << "       data sequence              (double)[stdin]" << std::endl;
  *stream << "  stdout:" << std::endl;
  *stream << "       decimated data sequence    (double)" << std::endl;
  *stream << std::endl;
  *stream << " SPTK: version " << sptk::kVersion << std::endl;
  *stream << std::endl;
  // clang-format on
}